

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

bool __thiscall
Lowerer::GenerateFastStringCheck
          (Lowerer *this,Instr *instr,RegOpnd *srcReg1,RegOpnd *srcReg2,bool isEqual,bool isStrict,
          LabelInstr *labelHelper,LabelInstr *labelBranchSuccess,LabelInstr *labelBranchFail)

{
  Func **ppFVar1;
  LowererMD *this_00;
  code *pcVar2;
  bool bVar3;
  RegOpnd *pRVar4;
  RegOpnd *baseOpnd;
  Lowerer *baseOpnd_00;
  RegOpnd *dst;
  HelperCallOpnd *src1Opnd;
  Instr *instr_00;
  IndirOpnd *pIVar5;
  IntConstOpnd *pIVar6;
  undefined4 *puVar7;
  uint uVar8;
  Lowerer *pLVar9;
  RegOpnd *otherOpnd;
  
  uVar8 = instr->m_opcode - 0xc;
  if (((0x36 < uVar8) || ((0x70800000000303U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) &&
     (3 < instr->m_opcode - 0x194)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5f33,
                       "(instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrSrEq_A || instr->m_opcode == Js::OpCode::BrSrNeq_A || instr->m_opcode == Js::OpCode::BrEq_A || instr->m_opcode == Js::OpCode::BrNeq_A || instr->m_opcode == Js::OpCode::BrSrNotEq_A || instr->m_opcode == Js::OpCode::BrSrNotNeq_A || instr->m_opcode == Js::OpCode::BrNotEq_A || instr->m_opcode == Js::OpCode::BrNotNeq_A || instr->m_opcode == Js::OpCode::CmEq_A || instr->m_opcode == Js::OpCode::CmNeq_A || instr->m_opcode == Js::OpCode::CmSrEq_A || instr->m_opcode == Js::OpCode::CmSrNeq_A"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
  }
  GenerateStringTest(this,srcReg1,instr,labelHelper,(LabelInstr *)0x0,true);
  pLVar9 = (Lowerer *)srcReg1;
  bVar3 = IR::Opnd::IsEqual(&srcReg1->super_Opnd,&srcReg2->super_Opnd);
  if (bVar3) {
    InsertBranch(Br,false,labelBranchSuccess,instr);
    if (instr->m_kind == InstrKindBranch) {
      ppFVar1 = &instr[1].m_next[1].m_func;
      *(byte *)ppFVar1 = *(byte *)ppFVar1 | 0x20;
    }
  }
  else {
    InsertCompareBranch(pLVar9,&srcReg1->super_Opnd,&srcReg2->super_Opnd,BrEq_A,false,
                        labelBranchSuccess,instr,false);
    if (isStrict) {
      GenerateStringTest(this,srcReg2,instr,labelBranchFail,(LabelInstr *)0x0,true);
      pRVar4 = srcReg2;
      if (((srcReg1->m_sym->field_0x19 & 8) != 0) ||
         (pRVar4 = srcReg1, (srcReg2->m_sym->field_0x19 & 8) != 0)) {
        pIVar5 = IR::IndirOpnd::New(pRVar4,0x18,TyUint32,this->m_func,false);
        pLVar9 = (Lowerer *)0x0;
        pIVar6 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,true);
        InsertCompareBranch(pLVar9,&pIVar5->super_Opnd,&pIVar6->super_Opnd,BrNeq_A,false,
                            labelBranchFail,instr,false);
        return true;
      }
    }
    else {
      GenerateStringTest(this,srcReg2,instr,labelHelper,(LabelInstr *)0x0,true);
    }
    pRVar4 = IR::RegOpnd::New(TyUint32,this->m_func);
    pIVar5 = IR::IndirOpnd::New(srcReg1,0x18,TyUint32,this->m_func,false);
    InsertMove(&pRVar4->super_Opnd,&pIVar5->super_Opnd,instr,true);
    pLVar9 = (Lowerer *)srcReg2;
    pIVar5 = IR::IndirOpnd::New(srcReg2,0x18,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar9,&pIVar5->super_Opnd,&pRVar4->super_Opnd,BrNeq_A,false,labelBranchFail
                        ,instr,false);
    baseOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
    pIVar5 = IR::IndirOpnd::New(srcReg1,0x10,TyUint64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar5->super_Opnd,instr,true);
    pLVar9 = (Lowerer *)0x0;
    pIVar6 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar9,&baseOpnd->super_Opnd,&pIVar6->super_Opnd,BrEq_A,false,labelHelper,
                        instr,false);
    baseOpnd_00 = (Lowerer *)IR::RegOpnd::New(TyUint64,this->m_func);
    pIVar5 = IR::IndirOpnd::New(srcReg2,0x10,TyUint64,this->m_func,false);
    InsertMove((Opnd *)baseOpnd_00,&pIVar5->super_Opnd,instr,true);
    pLVar9 = (Lowerer *)0x0;
    pIVar6 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    InsertCompareBranch(pLVar9,(Opnd *)baseOpnd_00,&pIVar6->super_Opnd,BrEq_A,false,labelHelper,
                        instr,false);
    dst = IR::RegOpnd::New(TyUint16,this->m_func);
    pIVar5 = IR::IndirOpnd::New(baseOpnd,0,TyUint16,this->m_func,false);
    InsertMove(&dst->super_Opnd,&pIVar5->super_Opnd,instr,true);
    pLVar9 = baseOpnd_00;
    pIVar5 = IR::IndirOpnd::New((RegOpnd *)baseOpnd_00,0,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar9,&pIVar5->super_Opnd,&dst->super_Opnd,BrNeq_A,false,labelBranchFail,
                        instr,false);
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,instr,&pRVar4->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instr,&baseOpnd->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instr,(Opnd *)baseOpnd_00);
    pRVar4 = IR::RegOpnd::New(TyInt32,this->m_func);
    src1Opnd = IR::HelperCallOpnd::New(HelperWMemCmp,this->m_func);
    instr_00 = IR::Instr::New(Call,&pRVar4->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,instr_00);
    LowererMD::LowerCall(this_00,instr_00,3);
    InsertTest(&pRVar4->super_Opnd,&pRVar4->super_Opnd,instr);
    InsertBranch(BrEq_A,false,labelBranchSuccess,instr);
    InsertBranch(Br,false,labelBranchFail,instr);
  }
  return true;
}

Assistant:

bool
Lowerer::GenerateFastStringCheck(IR::Instr *instr, IR::RegOpnd *srcReg1, IR::RegOpnd *srcReg2, bool isEqual, bool isStrict, IR::LabelInstr *labelHelper, IR::LabelInstr *labelBranchSuccess, IR::LabelInstr *labelBranchFail)
{
    Assert(instr->m_opcode == Js::OpCode::BrSrEq_A ||
        instr->m_opcode == Js::OpCode::BrSrNeq_A ||
        instr->m_opcode == Js::OpCode::BrEq_A ||
        instr->m_opcode == Js::OpCode::BrNeq_A ||
        instr->m_opcode == Js::OpCode::BrSrNotEq_A ||
        instr->m_opcode == Js::OpCode::BrSrNotNeq_A ||
        instr->m_opcode == Js::OpCode::BrNotEq_A ||
        instr->m_opcode == Js::OpCode::BrNotNeq_A ||
        instr->m_opcode == Js::OpCode::CmEq_A ||
        instr->m_opcode == Js::OpCode::CmNeq_A ||
        instr->m_opcode == Js::OpCode::CmSrEq_A ||
        instr->m_opcode == Js::OpCode::CmSrNeq_A);

    // if src1 is not string
    // generate object test, if not equal jump to $helper
    // compare type check to string, if not jump to $helper
    //
    // if strict mode generate string test as above for src2 and jump to $failure if failed any time
    // else if not strict generate string test as above for src2 and jump to $helper if failed any time
    //
    // Compare length of src1 and src2 if not equal goto $failure
    //
    // if src1 is not flat string jump to $helper
    //
    // if src1 and src2 m_pszValue pointer match goto $success
    //
    // if src2 is not flat string jump to $helper
    //
    // if first character of src1 and src2 doesn't match goto $failure
    //
    // shift left by 1 length of src1 (length*2)
    //
    // wmemcmp src1 and src2 flat strings till length * 2
    //
    // test eax (result of wmemcmp)
    // if equal jump to $success else to $failure
    //
    // $success
    //     jmp to $fallthrough
    // $failure
    //     jmp to $fallthrough
    // $helper
    //
    // $fallthrough

    // Generates:
    //      GenerateObjectTest(src1);
    //      CMP srcReg1, srcReg2
    //      JEQ $success
    //      MOV s1, [srcReg1 + offset(Type)]
    //      CMP type, static_string_type
    //      JNE $helper
    //      GenerateObjectTest(src2);
    //      MOV s2, [srcReg2 + offset(Type)]
    //      CMP type, static_string_type
    //      JNE $fail                         ; if src1 is string but not src2, src1 !== src2 if isStrict
    //      MOV s3, [srcReg1,offset(m_charLength)]
    //      CMP [srcReg2,offset(m_charLength)], s3
    //      JNE $fail                     <--- length check done
    //      MOV s4, [srcReg1,offset(m_pszValue)]
    //      CMP s4, 0
    //      JEQ $helper
    //      MOV s5, [srcReg2,offset(m_pszValue)]
    //      CMP s5, 0
    //      JEQ $helper
    //      MOV s6,[s4]
    //      CMP [s5], s6                       -First character comparison
    //      JNE $fail
    //      SHL length, 1
    //      eax = wmemcmp(src1String, src2String, length*2)
    //      TEST eax, eax
    //      JEQ $success
    //      JMP $fail
    IR::Instr* instrInsert = instr;

    GenerateStringTest(srcReg1, instrInsert, labelHelper);

    if (srcReg1->IsEqual(srcReg2))
    {
        InsertBranch(Js::OpCode::Br, labelBranchSuccess, instrInsert);
#if DBG
        if (instr->IsBranchInstr())
        {
            // we might have other cases on helper path which will generate branch to the target
            instr->AsBranchInstr()->GetTarget()->m_noHelperAssert = true;
        }
#endif
        return true;
    }
    //      CMP srcReg1, srcReg2                       - Ptr comparison
    //      JEQ $branchSuccess
    InsertCompareBranch(srcReg1, srcReg2, Js::OpCode::BrEq_A, labelBranchSuccess, instrInsert);

    if (isStrict)
    {
        GenerateStringTest(srcReg2, instrInsert, labelBranchFail);
    }
    else
    {
        GenerateStringTest(srcReg2, instrInsert, labelHelper);
    }

    if (isStrict && (srcReg1->m_sym->m_isStrEmpty || srcReg2->m_sym->m_isStrEmpty))
    {
        IR::RegOpnd* otherOpnd = srcReg1->m_sym->m_isStrEmpty ? srcReg2 : srcReg1;
        InsertCompareBranch(IR::IndirOpnd::New(otherOpnd, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), IR::IntConstOpnd::New(0, TyUint32, this->m_func, true), Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);
        return true;
    }

    //      MOV s3, [srcReg1,offset(m_charLength)]
    //      CMP [srcReg2,offset(m_charLength)], s3
    //      JNE $branchfail

    IR::RegOpnd * src1LengthOpnd = IR::RegOpnd::New(TyUint32, m_func);
    InsertMove(src1LengthOpnd, IR::IndirOpnd::New(srcReg1, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), instrInsert);
    InsertCompareBranch(IR::IndirOpnd::New(srcReg2, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, m_func), src1LengthOpnd, Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);

    //      MOV s4, [src1,offset(m_pszValue)]
    //      CMP s4, 0
    //      JEQ $helper
    //      MOV s5, [src2,offset(m_pszValue)]
    //      CMP s5, 0
    //      JEQ $helper

    IR::RegOpnd * src1FlatString = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src1FlatString, IR::IndirOpnd::New(srcReg1, Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, m_func), instrInsert);
    InsertCompareBranch(src1FlatString, IR::IntConstOpnd::New(0, TyUint32, m_func), Js::OpCode::BrEq_A, labelHelper, instrInsert);

    IR::RegOpnd * src2FlatString = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(src2FlatString, IR::IndirOpnd::New(srcReg2, Js::JavascriptString::GetOffsetOfpszValue(), TyMachPtr, m_func), instrInsert);
    InsertCompareBranch(src2FlatString, IR::IntConstOpnd::New(0, TyUint32, m_func), Js::OpCode::BrEq_A, labelHelper, instrInsert);

    //      MOV s6,[s4]
    //      CMP [s5], s6                       -First character comparison
    //      JNE $branchfail

    IR::RegOpnd * src1FirstChar = IR::RegOpnd::New(TyUint16, m_func);
    InsertMove(src1FirstChar, IR::IndirOpnd::New(src1FlatString, 0, TyUint16, m_func), instrInsert);
    InsertCompareBranch(IR::IndirOpnd::New(src2FlatString, 0, TyUint16, m_func), src1FirstChar, Js::OpCode::BrNeq_A, labelBranchFail, instrInsert);

    // eax = wmemcmp(src1String, src2String, length)

    m_lowererMD.LoadHelperArgument(instr, src1LengthOpnd);
    m_lowererMD.LoadHelperArgument(instr, src1FlatString);
    m_lowererMD.LoadHelperArgument(instr, src2FlatString);
    IR::RegOpnd *dstOpnd = IR::RegOpnd::New(TyInt32, this->m_func);
    IR::Instr *instrCall = IR::Instr::New(Js::OpCode::Call, dstOpnd, IR::HelperCallOpnd::New(IR::HelperWMemCmp, m_func), m_func);
    instr->InsertBefore(instrCall);
    m_lowererMD.LowerCall(instrCall, 3);

    // TEST eax, eax
    // JEQ success
    InsertTestBranch(dstOpnd, dstOpnd, Js::OpCode::BrEq_A, labelBranchSuccess, instrInsert);
    // JMP fail
    InsertBranch(Js::OpCode::Br, labelBranchFail, instrInsert);

    return true;
}